

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void av1_write_last_tile_info
               (AV1_COMP *cpi,FrameHeaderInfo *fh_info,aom_write_bit_buffer *saved_wb,
               size_t *curr_tg_data_size,uint8_t *curr_tg_start,uint32_t *total_size,
               uint8_t **tile_data_start,int *largest_tile_id,int *is_first_tg,
               uint32_t obu_header_size,uint8_t obu_extn_header)

{
  int iVar1;
  size_t obu_payload_size_00;
  uint8_t *dest;
  size_t *in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  void *in_R8;
  int *in_R9;
  size_t length_field_size;
  size_t obu_payload_size;
  
  obu_payload_size_00 = *in_RCX - ((ulong)curr_tg_start & 0xffffffff);
  dest = (uint8_t *)obu_memmove_unsafe((size_t)in_RCX,(size_t)in_R8,(uint8_t *)in_R9);
  iVar1 = av1_write_uleb_obu_size_unsafe(obu_payload_size_00,dest);
  if (iVar1 != 0) {
    aom_internal_error((aom_internal_error_info *)in_RDI[0x77f6],AOM_CODEC_ERROR,
                       "av1_write_last_tile_info: output buffer full");
  }
  *in_RCX = (size_t)(dest + *in_RCX);
  *in_R9 = (int)dest + *in_R9;
  *(uint8_t **)length_field_size = dest + *(long *)length_field_size;
  if (*(int *)((long)in_RDI + 0x9d4c4) == 1) {
    *in_RDX = (long)(dest + *in_RDX);
  }
  if ((*total_size == 0) && ((*(byte *)((long)in_RDI + 0x3c176) & 1) != 0)) {
    memmove((void *)((long)in_R8 + in_RSI[2]),in_R8,*in_RCX);
    memcpy(in_R8,(void *)*in_RSI,in_RSI[2]);
    *(undefined4 *)obu_payload_size = 0;
    av1_write_obu_header
              ((AV1LevelParams *)(*in_RDI + 0x5a90),(int *)(in_RDI + 0x13a60),
               OBU_REDUNDANT_FRAME_HEADER,(_Bool)(*(byte *)(in_RDI[0x8401] + 0xf4) & 1),true,
               (uint)(byte)curr_tg_data_size,(uint8_t *)((long)in_R8 + in_RSI[1]));
    *in_RCX = in_RSI[2] + *in_RCX;
    *in_R9 = (int)in_RSI[2] + *in_R9;
  }
  *total_size = 0;
  return;
}

Assistant:

void av1_write_last_tile_info(
    AV1_COMP *const cpi, const FrameHeaderInfo *fh_info,
    struct aom_write_bit_buffer *saved_wb, size_t *curr_tg_data_size,
    uint8_t *curr_tg_start, uint32_t *const total_size,
    uint8_t **tile_data_start, int *const largest_tile_id,
    int *const is_first_tg, uint32_t obu_header_size, uint8_t obu_extn_header) {
  // write current tile group size
  const size_t obu_payload_size = *curr_tg_data_size - obu_header_size;
  const size_t length_field_size =
      obu_memmove_unsafe(obu_header_size, obu_payload_size, curr_tg_start);
  if (av1_write_uleb_obu_size_unsafe(
          obu_payload_size, curr_tg_start + obu_header_size) != AOM_CODEC_OK) {
    aom_internal_error(cpi->common.error, AOM_CODEC_ERROR,
                       "av1_write_last_tile_info: output buffer full");
  }
  *curr_tg_data_size += length_field_size;
  *total_size += (uint32_t)length_field_size;
  *tile_data_start += length_field_size;
  if (cpi->num_tg == 1) {
    // if this tg is combined with the frame header then update saved
    // frame header base offset according to length field size
    saved_wb->bit_buffer += length_field_size;
  }

  if (!(*is_first_tg) && cpi->common.features.error_resilient_mode) {
    // Make room for a duplicate Frame Header OBU.
    memmove(curr_tg_start + fh_info->total_length, curr_tg_start,
            *curr_tg_data_size);

    // Insert a copy of the Frame Header OBU.
    memcpy(curr_tg_start, fh_info->frame_header, fh_info->total_length);

    // Force context update tile to be the first tile in error
    // resilient mode as the duplicate frame headers will have
    // context_update_tile_id set to 0
    *largest_tile_id = 0;

    // Rewrite the OBU header to change the OBU type to Redundant Frame
    // Header.
    av1_write_obu_header(
        &cpi->ppi->level_params, &cpi->frame_header_count,
        OBU_REDUNDANT_FRAME_HEADER,
        cpi->common.seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/true, obu_extn_header,
        &curr_tg_start[fh_info->obu_header_byte_offset]);

    *curr_tg_data_size += fh_info->total_length;
    *total_size += (uint32_t)fh_info->total_length;
  }
  *is_first_tg = 0;
}